

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O0

void __thiscall QWidgetWindow::updateNormalGeometry(QWidgetWindow *this)

{
  bool bVar1;
  QTLWExtra *value;
  QWidgetWindow *context;
  QWidget *this_00;
  QRect *pQVar2;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QPlatformWindow *pw;
  QTLWExtra *tle;
  QRect normalGeometry;
  uint in_stack_ffffffffffffff9c;
  QFlagsStorageHelper<Qt::WindowState,_4> local_3c;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b7cde);
  QWidget::d_func((QWidget *)0x3b7ce6);
  value = QWidgetPrivate::maybeTopData(in_RDI);
  if (value != (QTLWExtra *)0x0) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QRect::QRect((QRect *)in_RDI);
    context = (QWidgetWindow *)QWindow::handle();
    if (context != (QWidgetWindow *)0x0) {
      local_38 = (**(code **)(*(long *)context + 0x38))();
      local_28 = (undefined1  [16])
                 QHighDpi::fromNativePixels<QRect,QWidgetWindow>((QRect *)value,context);
      local_18 = (undefined1 *)local_28._0_8_;
      local_10 = (undefined1 *)local_28._8_8_;
    }
    bVar1 = QRect::isValid((QRect *)in_RDI);
    in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c & 0xffffff;
    if (!bVar1) {
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b7da0);
      QWidget::windowState((QWidget *)in_RDI);
      local_3c.super_QFlagsStorage<Qt::WindowState>.i =
           (QFlagsStorage<Qt::WindowState>)
           QFlags<Qt::WindowState>::operator&
                     ((QFlags<Qt::WindowState> *)in_RDI,in_stack_ffffffffffffff9c);
      bVar1 = QFlags<Qt::WindowState>::operator!((QFlags<Qt::WindowState> *)&local_3c);
      in_stack_ffffffffffffff9c = (uint)bVar1 << 0x18;
    }
    if ((char)(in_stack_ffffffffffffff9c >> 0x18) != '\0') {
      this_00 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b7de5);
      pQVar2 = QWidget::geometry(this_00);
      local_18 = *(undefined1 **)pQVar2;
      local_10 = *(undefined1 **)&pQVar2->x2;
    }
    bVar1 = QRect::isValid((QRect *)in_RDI);
    if (bVar1) {
      *(undefined1 **)&value->normalGeometry = local_18;
      *(undefined1 **)&(value->normalGeometry).x2 = local_10;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetWindow::updateNormalGeometry()
{
    QTLWExtra *tle = m_widget->d_func()->maybeTopData();
    if (!tle)
        return;
     // Ask platform window, default to widget geometry.
    QRect normalGeometry;
    if (const QPlatformWindow *pw = handle())
        normalGeometry = QHighDpi::fromNativePixels(pw->normalGeometry(), this);
    if (!normalGeometry.isValid() && !(m_widget->windowState() & ~Qt::WindowActive))
        normalGeometry = m_widget->geometry();
    if (normalGeometry.isValid())
        tle->normalGeometry = normalGeometry;
}